

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerSettings.cpp
# Opt level: O2

bool __thiscall HdlcAnalyzerSettings::SetSettingsFromInterfaces(HdlcAnalyzerSettings *this)

{
  U32 UVar1;
  double dVar2;
  Channel aCStack_28 [16];
  
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::operator=(&this->mInputChannel,aCStack_28);
  Channel::~Channel(aCStack_28);
  UVar1 = AnalyzerSettingInterfaceInteger::GetInteger();
  this->mBitRate = UVar1;
  dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
  this->mTransmissionMode = (HdlcTransmissionModeType)(long)dVar2;
  dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
  this->mHdlcAddr = (HdlcAddressType)(long)dVar2;
  dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
  this->mHdlcControl = (HdlcControlType)(long)dVar2;
  dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
  this->mHdlcFcs = (HdlcFcsType)(long)dVar2;
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  return true;
}

Assistant:

bool HdlcAnalyzerSettings::SetSettingsFromInterfaces()
{
    mInputChannel = mInputChannelInterface->GetChannel();
    mBitRate = mBitRateInterface->GetInteger();
    mTransmissionMode = HdlcTransmissionModeType( U32( mHdlcTransmissionInterface->GetNumber() ) );
    mHdlcAddr = HdlcAddressType( U32( mHdlcAddrInterface->GetNumber() ) );
    mHdlcControl = HdlcControlType( U32( mHdlcControlInterface->GetNumber() ) );
    mHdlcFcs = HdlcFcsType( U32( mHdlcFcsInterface->GetNumber() ) );

    ClearChannels();
    AddChannel( mInputChannel, "HDLC", true );

    return true;
}